

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test_content.h
# Opt level: O2

void __thiscall data::form_test::form_test(form_test *this)

{
  form *this_00;
  text *this_01;
  long lVar1;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  
  master::master(&this->super_master);
  *(undefined ***)&this->super_master = &PTR__form_test_0011bc88;
  this_00 = &this->f;
  cppcms::form::form(this_00);
  this_01 = &this->t1;
  cppcms::widgets::text::text(this_01);
  cppcms::widgets::text::text(&this->t2);
  cppcms::form::add((base_widget *)this_00);
  cppcms::form::add((base_widget *)this_00);
  lVar1 = *(long *)(*(long *)this_01 + -0x18);
  std::__cxx11::string::string(local_48,"msg",&local_69);
  cppcms::widgets::base_widget::message(this_01 + lVar1,local_48);
  std::__cxx11::string::~string(local_48);
  lVar1 = *(long *)(*(long *)this_01 + -0x18);
  std::__cxx11::string::string(local_68,"help",&local_69);
  cppcms::widgets::base_widget::help(this_01 + lVar1,local_68);
  std::__cxx11::string::~string(local_68);
  return;
}

Assistant:

form_test()
		{
			f.add(t1);
			f.add(t2);
			t1.message("msg");
			t1.help("help");
		}